

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

char * stringify(char *str,VARR_char *to)

{
  char *pcVar1;
  VARR_char *to_local;
  char *str_local;
  
  VARR_chartrunc(to,0);
  VARR_charpush(to,'\"');
  for (to_local = (VARR_char *)str; (char)to_local->els_num != '\0';
      to_local = (VARR_char *)((long)&to_local->els_num + 1)) {
    if (((char)to_local->els_num == '\"') || ((char)to_local->els_num == '\\')) {
      VARR_charpush(to,'\\');
    }
    VARR_charpush(to,(char)to_local->els_num);
  }
  VARR_charpush(to,'\"');
  pcVar1 = VARR_charaddr(to);
  return pcVar1;
}

Assistant:

static const char *stringify (const char *str, VARR (char) * to) {
  VARR_TRUNC (char, to, 0);
  VARR_PUSH (char, to, '"');
  for (; *str != '\0'; str++) {
    if (*str == '\"' || *str == '\\') VARR_PUSH (char, to, '\\');
    VARR_PUSH (char, to, *str);
  }
  VARR_PUSH (char, to, '"');
  return VARR_ADDR (char, to);
}